

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

int tcg_gen_code_sparc(TCGContext_conflict7 *s,TranslationBlock *tb)

{
  anon_union_16_2_aaf24f3d_for_link *paVar1;
  TCGTemp **__s;
  ushort uVar2;
  TCGOp *pTVar3;
  TCGArg TVar4;
  TCGTemp *ts;
  tcg_target_ulong tVar5;
  TCGOpDef *pTVar6;
  ulong *puVar7;
  TCGArgConstraint *pTVar8;
  uintptr_t value;
  TCGRegSet *pTVar9;
  uint *puVar10;
  void *pvVar11;
  anon_union_16_2_aaf24f3d_for_link *paVar12;
  TCGLabel *pTVar13;
  tcg_insn_unit tVar14;
  TCGType_conflict TVar15;
  byte bVar16;
  _Bool _Var17;
  TCGLifeData arg_life;
  TCGOpcode TVar18;
  TCGReg TVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  char *pcVar23;
  TCGOp *pTVar24;
  TCGOp *pTVar25;
  TCGTemp *pTVar26;
  TCGCond *pTVar27;
  byte *pbVar28;
  tcg_insn_unit *ptVar29;
  uint8_t *puVar30;
  QTailQLink *pQVar31;
  QTailQLink *extraout_RAX;
  void **ppvVar32;
  QTailQLink *extraout_RAX_00;
  QTailQLink *extraout_RAX_01;
  byte bVar33;
  char cVar39;
  uint uVar34;
  TCGReg arg;
  int src;
  TCGCond base;
  ulong uVar35;
  undefined1 *puVar36;
  TCGLabel *pTVar37;
  QTailQLink *pQVar38;
  int iVar40;
  TCGCond r;
  TCGArg TVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  TCGOpcode TVar45;
  TCGReg TVar46;
  int opc;
  TCGType_conflict TVar47;
  TCGCond TVar48;
  long lVar49;
  ulong uVar50;
  uint uVar51;
  long lVar52;
  TCGContext_conflict7 *s_00;
  uint uVar53;
  ulong in_R9;
  TCGOp *pTVar54;
  uint uVar55;
  TCGRegSet allocated_regs;
  ulong uVar56;
  TCGLabel *pTVar57;
  TCGLabelQemuLdst *pTVar58;
  TCGRegSet TVar59;
  TCGType_conflict type;
  TCGType_conflict rexw;
  long lVar60;
  tcg_insn_unit **pptVar61;
  byte bVar62;
  int iVar63;
  long lVar64;
  undefined2 uVar65;
  TCGOpcode *pTVar66;
  ulong uVar67;
  TCGRelocation *pTVar68;
  bool bVar69;
  target_ulong_conflict atVar70 [2];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  TCGArg new_args [16];
  byte bStackY_1e9;
  QTailQLink *pQStackY_1d0;
  uint uStackY_1bc;
  TCGLabel *in_stack_fffffffffffffe98;
  uint local_124;
  TCGLabel *local_f8;
  TCGLabel *local_f0;
  TCGLabel *local_e8;
  tcg_insn_unit local_e0;
  undefined4 uStack_dc;
  ulong local_d8;
  TCGCond local_d0;
  undefined4 uStack_cc;
  int local_78;
  int local_74;
  int local_70;
  int local_68;
  int local_64;
  
  pcVar23 = getenv("UNICORN_DEBUG");
  if (pcVar23 != (char *)0x0) {
    tcg_dump_ops_sparc(s,false,"TCG before optimization:");
  }
  tcg_optimize_sparc(s);
  if ((s->ops).tqh_first != (TCGOp *)0x0) {
    bVar16 = 0;
    pTVar54 = (s->ops).tqh_first;
    do {
      pTVar3 = (pTVar54->link).tqe_next;
      uVar43 = *(uint *)pTVar54;
      uVar34 = uVar43 & 0xff;
      bVar33 = bVar16;
      if (uVar34 < 0x81) {
        if (uVar34 == 1) {
          uVar43 = *(uint *)pTVar54->args[0];
          if (0xffff < uVar43) {
            if ((((uVar43 & 0xffff0000) != 0x10000) ||
                (pTVar24 = (TCGOp *)((pTVar54->link).tqe_circ.tql_prev)->tql_prev->tql_next,
                *(char *)pTVar24 != '\x03')) ||
               ((uint *)pTVar54->args[0] != (uint *)pTVar24->args[0])) {
              bVar16 = 0;
              goto LAB_009d7bb2;
            }
            tcg_op_remove_sparc(s,pTVar24);
            bVar16 = 0;
          }
        }
        else {
          if (uVar34 == 2) {
            bVar33 = ((byte)pTVar54->args[(ulong)((uVar43 >> 8 & 0xf) + (uVar43 >> 0xc & 0xf)) + 1]
                     & 8) >> 3 | bVar16;
          }
          else if (uVar34 == 3) goto LAB_009d7b3e;
LAB_009d7b9e:
          bVar69 = bVar16 == 0;
          bVar16 = bVar33;
          if (bVar69) goto LAB_009d7bb2;
        }
        tcg_op_remove_sparc(s,pTVar54);
      }
      else if (uVar34 != 0x81) {
        if ((uVar34 == 0x82) || (uVar34 == 0x84)) {
LAB_009d7b3e:
          bVar33 = 1;
        }
        goto LAB_009d7b9e;
      }
LAB_009d7bb2:
      pTVar54 = pTVar3;
    } while (pTVar3 != (TCGOp *)0x0);
  }
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    uVar43 = s->nb_globals;
    if ((long)(int)uVar43 < 1) {
      uVar43 = 0;
    }
    else {
      lVar49 = 0;
      do {
        if (((&s->temps[0].field_0x4)[lVar49] & 2) == 0) {
          pTVar26 = (TCGTemp *)0x0;
        }
        else {
          iVar21 = s->nb_temps;
          s->nb_temps = iVar21 + 1;
          pTVar26 = s->temps + iVar21;
          s->temps[iVar21].name = (char *)0x0;
          s->temps[iVar21].state = 0;
          s->temps[iVar21].mem_base = (TCGTemp *)0x0;
          s->temps[iVar21].mem_offset = 0;
          *(undefined1 (*) [16])(s->temps + iVar21) = (undefined1  [16])0x0;
          s->temps[iVar21].state_ptr = (void *)0x0;
          in_R9 = (ulong)(byte)(&s->temps[0].field_0x3)[lVar49] << 0x18;
          *(ulong *)(s->temps + iVar21) = in_R9;
          *(ulong *)(s->temps + iVar21) =
               (ulong)((uint)(byte)(&s->temps[0].field_0x2)[lVar49] << 0x10 | (uint)in_R9);
        }
        *(TCGTemp **)((long)&s->temps[0].state_ptr + lVar49) = pTVar26;
        *(undefined8 *)((long)&s->temps[0].state + lVar49) = 1;
        lVar49 = lVar49 + 0x38;
      } while ((long)(int)uVar43 * 0x38 - lVar49 != 0);
    }
    if ((int)uVar43 < s->nb_temps) {
      lVar49 = (ulong)(uint)s->nb_temps - (ulong)uVar43;
      ppvVar32 = &s->temps[uVar43].state_ptr;
      do {
        *ppvVar32 = (void *)0x0;
        ppvVar32[-1] = (void *)0x1;
        ppvVar32 = ppvVar32 + 7;
        lVar49 = lVar49 + -1;
      } while (lVar49 != 0);
    }
    if ((s->ops).tqh_first != (TCGOp *)0x0) {
      bVar69 = false;
      pTVar54 = (s->ops).tqh_first;
      do {
        uVar43 = *(uint *)pTVar54;
        if ((uVar43 & 0xff) == 2) {
          uVar42 = (ulong)(uVar43 >> 0xc & 0xf);
          uVar44 = uVar43 >> 8 & 0xf;
        }
        else {
          uVar34 = (uVar43 & 0xff) << 5;
          uVar44 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar34];
          uVar42 = (ulong)(&s->tcg_op_defs->nb_oargs)[uVar34];
        }
        pTVar3 = (pTVar54->link).tqe_next;
        uVar43 = uVar43 >> 0x10;
        if (uVar44 != 0) {
          uVar67 = (ulong)(uVar44 + (int)uVar42);
          uVar56 = uVar42;
          do {
            TVar41 = pTVar54->args[uVar56];
            if (((TVar41 != 0) && (TVar4 = *(TCGArg *)(TVar41 + 0x30), TVar4 != 0)) &&
               (*(long *)(TVar41 + 0x28) == 1)) {
              TVar45 = INDEX_op_ld_i32;
              if (*(char *)(TVar41 + 3) != '\0') {
                TVar45 = INDEX_op_ld_i64;
              }
              pTVar24 = tcg_op_alloc(s,TVar45);
              (pTVar24->link).tqe_circ.tql_prev = (pTVar54->link).tqe_circ.tql_prev;
              (pTVar24->link).tqe_next = pTVar54;
              ((pTVar54->link).tqe_circ.tql_prev)->tql_next = pTVar24;
              (pTVar54->link).tqe_circ.tql_prev = (QTailQLink *)&pTVar24->link;
              pTVar24->args[0] = TVar4;
              pTVar24->args[1] = *(TCGArg *)(TVar41 + 0x10);
              pTVar24->args[2] = *(TCGArg *)(TVar41 + 0x18);
              *(undefined8 *)(TVar41 + 0x28) = 2;
            }
            uVar56 = uVar56 + 1;
            uVar35 = uVar42;
          } while (uVar56 < uVar67);
          do {
            TVar41 = pTVar54->args[uVar35];
            if ((TVar41 != 0) && (*(TCGArg *)(TVar41 + 0x30) != 0)) {
              pTVar54->args[uVar35] = *(TCGArg *)(TVar41 + 0x30);
              bVar69 = true;
              if ((uVar43 >> ((byte)uVar35 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar41 + 0x28) = 1;
              }
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 < uVar67);
        }
        in_R9 = uVar42;
        if ((int)uVar42 != 0) {
          paVar1 = &pTVar54->link;
          uVar56 = 0;
          do {
            TVar41 = pTVar54->args[uVar56];
            TVar4 = *(TCGArg *)(TVar41 + 0x30);
            if (TVar4 != 0) {
              pTVar54->args[uVar56] = TVar4;
              *(undefined8 *)(TVar41 + 0x28) = 0;
              if ((uVar43 >> ((uint)uVar56 & 0x1f) & 1) != 0) {
                TVar45 = INDEX_op_st_i32;
                if (*(char *)(TVar41 + 3) != '\0') {
                  TVar45 = INDEX_op_st_i64;
                }
                pTVar25 = tcg_op_alloc(s,TVar45);
                pTVar24 = paVar1->tqe_next;
                (pTVar25->link).tqe_next = pTVar24;
                paVar12 = &pTVar24->link;
                if (pTVar24 == (TCGOp *)0x0) {
                  paVar12 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
                }
                (paVar12->tqe_circ).tql_prev = (QTailQLink *)&pTVar25->link;
                paVar1->tqe_next = pTVar25;
                (pTVar25->link).tqe_circ.tql_prev = (QTailQLink *)paVar1;
                pTVar25->args[0] = TVar4;
                pTVar25->args[1] = *(TCGArg *)(TVar41 + 0x10);
                pTVar25->args[2] = *(TCGArg *)(TVar41 + 0x18);
                *(undefined8 *)(TVar41 + 0x28) = 2;
              }
              bVar69 = true;
              if ((uVar43 >> ((byte)uVar56 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar41 + 0x28) = 1;
              }
            }
            uVar56 = uVar56 + 1;
          } while (uVar42 != uVar56);
        }
        pTVar54 = pTVar3;
      } while (pTVar3 != (TCGOp *)0x0);
      if (bVar69) {
        liveness_pass_1(s);
      }
    }
  }
  uVar43 = s->nb_globals;
  if ((long)(int)uVar43 < 1) {
    uVar43 = 0;
  }
  else {
    lVar49 = 0;
    do {
      (&s->temps[0].field_0x1)[lVar49] =
           (char)((uint)((*(ulong *)(&s->temps[0].field_0x0 + lVar49) & 0x100000000) == 0) * 0x100 +
                  0x100 >> 8);
      lVar49 = lVar49 + 0x38;
    } while ((long)(int)uVar43 * 0x38 - lVar49 != 0);
  }
  if ((int)uVar43 < s->nb_temps) {
    lVar49 = (ulong)(uint)s->nb_temps - (ulong)uVar43;
    pTVar26 = s->temps + uVar43;
    do {
      *(ulong *)pTVar26 =
           *(ulong *)pTVar26 & 0xffffffeeffff00ff |
           (ulong)((uint)(*(ulong *)pTVar26 >> 0x1d) & 0x200);
      pTVar26 = pTVar26 + 1;
      lVar49 = lVar49 + -1;
    } while (lVar49 != 0);
  }
  __s = s->reg_to_temp;
  memset(__s,0,0x100);
  ptVar29 = *(tcg_insn_unit **)&tb->cflags;
  s->code_buf = ptVar29;
  s->code_ptr = ptVar29;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &(s->ldst_labels).sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar23 = getenv("UNICORN_DEBUG");
  if (pcVar23 != (char *)0x0) {
    tcg_dump_ops_sparc(s,false,"TCG before codegen:");
  }
  pTVar66 = (TCGOpcode *)(s->ops).tqh_circ.tql_next;
  if (pTVar66 == (TCGOpcode *)0x0) {
    ptVar29 = s->code_ptr;
    uVar56 = (long)ptVar29 - (long)s->code_buf;
    local_124 = 0xffffffff;
  }
  else {
    local_124 = 0xffffffff;
    do {
      TVar45 = *pTVar66;
      arg_life = (TCGLifeData)(TVar45 >> 0x10);
      uVar42 = in_R9;
      if (INDEX_op_ctpop_i32 < (TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64))) {
        TVar18 = TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
        if (TVar18 < INDEX_op_mov_vec) {
          if (TVar18 != INDEX_op_mov_i64) {
            if (TVar18 == INDEX_op_movi_i64) goto switchD_009d80a8_caseD_6;
            if (TVar18 != INDEX_op_insn_start) goto switchD_009d80a8_caseD_3;
            if (((int)local_124 < 0) ||
               (uVar56 = (long)s->code_ptr - (long)s->code_buf,
               s->gen_insn_end_off[local_124] = (uint16_t)uVar56, uVar56 < 0x10000)) {
              lVar49 = (long)(int)local_124;
              local_124 = local_124 + 1;
              atVar70[1] = pTVar66[8];
              atVar70[0] = pTVar66[6];
              s->gen_insn_data[lVar49 + 1] = atVar70;
              goto LAB_009d9142;
            }
            goto LAB_009da79c;
          }
switchD_009d80a8_caseD_5:
          uVar43 = s->reserved_regs;
          uVar42 = (ulong)uVar43;
          TVar18 = pTVar66[0x1c];
          pTVar26 = *(TCGTemp **)(pTVar66 + 6);
          ts = *(TCGTemp **)(pTVar66 + 8);
          bVar16 = pTVar26->field_0x3;
          uVar56 = *(ulong *)ts;
          if ((char)(uVar56 >> 8) == '\x02') {
            temp_load(s,ts,s->tcg_target_available_regs[(uint)uVar56 >> 0x18],uVar43,TVar18);
            uVar56 = *(ulong *)ts;
          }
          else if (((uint)(uVar56 >> 8) & 0xff) == 3) {
            tVar5 = ts->val;
            if (((TVar45 >> 0x13 & 1) != 0) && ((uVar56 & 0x100000000) == 0)) {
              if (((uint)uVar56 & 0xff00) == 0x100) {
                __s[uVar56 & 0xff] = (TCGTemp *)0x0;
                uVar56 = *(ulong *)ts;
              }
              uVar67 = uVar56 >> 0x1c & 0x200;
              if ((uVar56 & 0x4000000000) != 0) {
                uVar67 = 0x200;
              }
              *(ulong *)ts = uVar56 & 0xffffffffffff00ff | uVar67;
            }
            tcg_reg_alloc_do_movi(s,pTVar26,tVar5,arg_life,TVar18);
            goto LAB_009d9142;
          }
          uVar42 = (ulong)uVar43;
          if ((TVar45 >> 0x12 & 1) == 0) {
            uVar67 = *(ulong *)pTVar26;
            uVar34 = (uint)uVar67 & 0xff00;
            if (((TVar45 >> 0x13 & 1) == 0) || ((uVar56 & 0x100000000) != 0)) {
              if (uVar34 != 0x100) {
                uVar43 = uVar43 | 1 << ((uint)uVar56 & 0x1f);
                TVar19 = tcg_reg_alloc(s,s->tcg_target_available_regs[bVar16],uVar43,TVar18,
                                       (uVar67 & 0x400000000) != 0);
                uVar67 = *(ulong *)pTVar26 & 0xffffffffffffff00 | (ulong)(TVar19 & 0xff);
                *(ulong *)pTVar26 = uVar67;
                uVar56 = *(ulong *)ts;
              }
              tcg_out_mov(s,(uint)bVar16,(TCGReg)uVar67 & 0xff,(TCGReg)uVar56 & 0xff);
              uVar42 = (ulong)uVar43;
            }
            else {
              if (uVar34 == 0x100) {
                __s[uVar67 & 0xff] = (TCGTemp *)0x0;
                uVar56 = (ulong)*(byte *)ts;
                uVar67 = *(ulong *)pTVar26;
              }
              *(ulong *)pTVar26 = uVar67 & 0xffffffffffffff00 | uVar56 & 0xff;
              uVar56 = *(ulong *)ts;
              if ((uVar56 & 0x100000000) == 0) {
                if (((uint)uVar56 & 0xff00) == 0x100) {
                  __s[uVar56 & 0xff] = (TCGTemp *)0x0;
                  uVar56 = *(ulong *)ts;
                }
                uVar67 = uVar56 >> 0x1c & 0x200;
                if ((uVar56 & 0x4000000000) != 0) {
                  uVar67 = 0x200;
                }
                *(ulong *)ts = uVar56 & 0xffffffffffff00ff | uVar67;
              }
            }
            uVar56 = *(ulong *)pTVar26;
            *(ulong *)pTVar26 = uVar56 & 0xfffffff7ffff00ff | 0x100;
            __s[uVar56 & 0xff] = pTVar26;
            if ((TVar45 >> 0x10 & 1) != 0) {
              temp_sync(s,pTVar26,(TCGRegSet)uVar42,0,0);
            }
            goto LAB_009d9142;
          }
          if ((pTVar26->field_0x4 & 0x10) == 0) {
            temp_allocate_frame(s,pTVar26);
            uVar56 = *(ulong *)ts;
          }
          tcg_out_st(s,(uint)bVar16,(TCGReg)uVar56 & 0xff,(uint)*(byte *)pTVar26->mem_base,
                     pTVar26->mem_offset);
          if (((TVar45 >> 0x13 & 1) != 0) && (uVar56 = *(ulong *)ts, (uVar56 & 0x100000000) == 0)) {
            if (((uint)uVar56 & 0xff00) == 0x100) {
              __s[uVar56 & 0xff] = (TCGTemp *)0x0;
              uVar56 = *(ulong *)ts;
            }
            uVar67 = uVar56 >> 0x1c & 0x200;
            if ((uVar56 & 0x4000000000) != 0) {
              uVar67 = 0x200;
            }
            *(ulong *)ts = uVar56 & 0xffffffffffff00ff | uVar67;
          }
          uVar56 = *(ulong *)pTVar26;
        }
        else {
          if (TVar18 != INDEX_op_dup_vec) {
            if (TVar18 == INDEX_op_dupi_vec) goto switchD_009d80a8_caseD_6;
            if (TVar18 != INDEX_op_mov_vec) goto switchD_009d80a8_caseD_3;
            goto switchD_009d80a8_caseD_5;
          }
          pTVar26 = *(TCGTemp **)(pTVar66 + 6);
          puVar7 = *(ulong **)(pTVar66 + 8);
          uVar56 = *puVar7;
          cVar39 = (char)(uVar56 >> 8);
          if (cVar39 == '\x03') {
            tVar5 = puVar7[1];
            if (((TVar45 >> 0x13 & 1) != 0) && ((uVar56 & 0x100000000) == 0)) {
              if (((uint)uVar56 & 0xff00) == 0x100) {
                __s[uVar56 & 0xff] = (TCGTemp *)0x0;
                uVar56 = *puVar7;
              }
              uVar42 = uVar56 >> 0x1c & 0x200;
              if ((uVar56 & 0x4000000000) != 0) {
                uVar42 = 0x200;
              }
              *puVar7 = uVar56 & 0xffffffffffff00ff | uVar42;
            }
            tcg_reg_alloc_do_movi(s,pTVar26,tVar5,arg_life,pTVar66[0x1c]);
            uVar42 = in_R9;
            goto LAB_009d9142;
          }
          pTVar8 = s->tcg_op_defs[0x8b].args_ct;
          uVar43 = pTVar8[1].u.regs;
          uVar67 = uVar56;
          if (((uint)*(ulong *)pTVar26 & 0xff00) != 0x100) {
            uVar34 = 1 << ((byte)uVar56 & 0x1f);
            if (cVar39 != '\x01' || (TVar45 & 0x80000) != INDEX_op_discard) {
              uVar34 = 0;
            }
            TVar19 = tcg_reg_alloc(s,(pTVar8->u).regs,uVar34 | s->reserved_regs,pTVar66[0x1c],
                                   (*(ulong *)pTVar26 & 0x400000000) != 0);
            *(ulong *)pTVar26 =
                 (*(ulong *)pTVar26 & 0xfffffff7ffff0000) + (ulong)(TVar19 & 0xff) + 0x100;
            s->reg_to_temp[TVar19 & 0xff] = pTVar26;
            uVar67 = *puVar7;
            uVar42 = in_R9;
          }
          uVar34 = TVar45 >> 0xc & 0xf;
          TVar47 = (TVar45 >> 8 & 0xf) + TCG_TYPE_V64;
          if ((char)(uVar67 >> 8) == '\x01') {
            TVar19 = (TCGReg)uVar67 & 0xff;
            if ((uVar43 >> ((TCGReg)uVar67 & TCG_REG_XMM15) & 1) == 0) {
              bVar16 = (byte)*(undefined8 *)pTVar26;
              if ((uVar67 >> 0x23 & 1) != 0) goto LAB_009d8dda;
              tcg_out_mov(s,(TCGType_conflict)(uVar56 >> 0x18) & 0xff,
                          (TCGReg)*(undefined8 *)pTVar26 & 0xff,TVar19);
              bVar16 = *(byte *)pTVar26;
              TVar19 = (TCGReg)bVar16;
            }
            else {
              bVar16 = *(byte *)pTVar26;
            }
            tcg_out_dup_vec(s,TVar47,uVar34,(uint)bVar16,TVar19);
          }
          else {
            if (((uint)(uVar67 >> 8) & 0xff) != 2) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
              ;
              iVar21 = 0xd22;
              goto LAB_009da7c7;
            }
            bVar16 = (byte)*(undefined8 *)pTVar26;
LAB_009d8dda:
            uVar42 = puVar7[3];
            tcg_out_dupm_vec(s,TVar47,uVar34,(uint)bVar16,(uint)*(byte *)puVar7[2],uVar42);
          }
          if (((TVar45 >> 0x13 & 1) != 0) && (uVar56 = *puVar7, (uVar56 & 0x100000000) == 0)) {
            if (((uint)uVar56 & 0xff00) == 0x100) {
              __s[uVar56 & 0xff] = (TCGTemp *)0x0;
              uVar56 = *puVar7;
            }
            uVar67 = uVar56 >> 0x1c & 0x200;
            if ((uVar56 & 0x4000000000) != 0) {
              uVar67 = 0x200;
            }
            *puVar7 = uVar56 & 0xffffffffffff00ff | uVar67;
          }
          if ((TVar45 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar26,s->reserved_regs,0,0);
          }
          if ((TVar45 >> 0x12 & 1) == 0) goto LAB_009d9142;
          uVar56 = *(ulong *)pTVar26;
        }
        if ((uVar56 & 0x100000000) == 0) {
          if (((uint)uVar56 & 0xff00) == 0x100) {
            __s[uVar56 & 0xff] = (TCGTemp *)0x0;
            uVar56 = *(ulong *)pTVar26;
          }
          uVar67 = uVar56 >> 0x1c & 0x200;
          if ((uVar56 & 0x4000000000) != 0) {
            uVar67 = 0x200;
          }
          *(ulong *)pTVar26 = uVar56 & 0xffffffffffff00ff | uVar67;
        }
        goto LAB_009d9142;
      }
      switch(TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) {
      case INDEX_op_discard:
        puVar7 = *(ulong **)(pTVar66 + 6);
        uVar56 = *puVar7;
        if ((uVar56 & 0x100000000) == 0) {
          if (((uint)uVar56 & 0xff00) == 0x100) {
            __s[uVar56 & 0xff] = (TCGTemp *)0x0;
            uVar56 = *puVar7;
          }
          uVar67 = uVar56 >> 0x1c & 0x200;
          if ((uVar56 & 0x4000000000) != 0) {
            uVar67 = 0x200;
          }
          *puVar7 = uVar56 & 0xffffffffffff00ff | uVar67;
        }
        goto LAB_009d9142;
      case INDEX_op_set_label:
        puVar10 = *(uint **)(pTVar66 + 6);
        ptVar29 = s->code_ptr;
        *puVar10 = *puVar10 | 2;
        *(tcg_insn_unit **)(puVar10 + 2) = ptVar29;
        goto LAB_009d9142;
      case INDEX_op_call:
        uVar34 = TVar45 >> 8 & 0xf;
        uVar43 = 6;
        if (uVar34 < 6) {
          uVar43 = TVar45 >> 8 & 0xf;
        }
        if (((long)(int)(uVar34 - uVar43) * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
          uVar44 = TVar45 >> 0xc & 0xf;
          uVar56 = (ulong)uVar44;
          ptVar29 = *(tcg_insn_unit **)(pTVar66 + (ulong)(uVar44 + uVar34) * 2 + 6);
          if (6 < uVar34) {
            lVar49 = 0;
            do {
              pTVar26 = *(TCGTemp **)((long)pTVar66 + lVar49 + uVar56 * 8 + 0x48);
              if (pTVar26 != (TCGTemp *)0x0) {
                temp_load(s,pTVar26,s->tcg_target_available_regs[(byte)pTVar26->field_0x3],
                          s->reserved_regs,0);
                tcg_out_st(s,*(TCGReg *)pTVar26 >> 0x18,*(TCGReg *)pTVar26 & 0xff,TCG_REG_CALL_STACK
                           ,lVar49);
              }
              lVar49 = lVar49 + 8;
            } while ((ulong)uVar34 * 8 + -0x30 != lVar49);
          }
          uVar55 = TVar45 >> 0x10;
          uVar22 = s->reserved_regs;
          uVar42 = in_R9;
          if ((TVar45 & 0xf00) != INDEX_op_discard) {
            uVar42 = 0;
            do {
              pTVar26 = *(TCGTemp **)((long)pTVar66 + uVar42 * 2 + uVar56 * 8 + 0x18);
              if (pTVar26 != (TCGTemp *)0x0) {
                TVar19 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar42);
                TVar46 = (TCGReg)*(undefined8 *)pTVar26;
                if ((TVar46 & 0xff00) == 0x100) {
                  arg = TVar46 & 0xff;
                  if (arg != TVar19) {
                    if (__s[TVar19] != (TCGTemp *)0x0) {
                      temp_sync(s,__s[TVar19],uVar22,0,-1);
                      TVar46 = *(TCGReg *)pTVar26;
                      arg = TVar46 & 0xff;
                    }
                    tcg_out_mov(s,TVar46 >> 0x18,TVar19,arg);
                  }
                }
                else {
                  if (__s[TVar19] != (TCGTemp *)0x0) {
                    temp_sync(s,__s[TVar19],uVar22,0,-1);
                  }
                  temp_load(s,pTVar26,1 << ((byte)TVar19 & 0x1f),uVar22,0);
                }
                uVar22 = uVar22 | 1 << (TVar19 & TCG_REG_XMM15);
              }
              uVar42 = uVar42 + 4;
              uVar67 = uVar56;
            } while (uVar43 << 2 != uVar42);
            do {
              if ((uVar55 >> ((byte)uVar67 & 0x1f) & 4) != 0) {
                puVar7 = *(ulong **)(pTVar66 + uVar67 * 2 + 6);
                uVar42 = *puVar7;
                if ((uVar42 & 0x100000000) == 0) {
                  if (((uint)uVar42 & 0xff00) == 0x100) {
                    __s[uVar42 & 0xff] = (TCGTemp *)0x0;
                    uVar42 = *puVar7;
                  }
                  uVar35 = uVar42 >> 0x1c & 0x200;
                  if ((uVar42 & 0x4000000000) != 0) {
                    uVar35 = 0x200;
                  }
                  *puVar7 = uVar42 & 0xffffffffffff00ff | uVar35;
                }
              }
              uVar67 = uVar67 + 1;
              uVar42 = (ulong)uVar55;
            } while (uVar67 < uVar44 + uVar34);
          }
          lVar49 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar49 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar49] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar49],uVar22,0,-1);
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 != 0x20);
          tcg_out_branch(s,1,ptVar29);
          if (uVar44 != 0) {
            uVar67 = 0;
            do {
              pTVar26 = *(TCGTemp **)(pTVar66 + uVar67 * 2 + 6);
              uVar35 = *(ulong *)pTVar26;
              if (((uint)uVar35 & 0xff00) == 0x100) {
                __s[uVar35 & 0xff] = (TCGTemp *)0x0;
                uVar35 = *(ulong *)pTVar26;
              }
              *(ulong *)pTVar26 = uVar35 & 0xfffffff7ffff0000 | 0x100;
              *__s = pTVar26;
              uVar43 = 4 << ((byte)uVar67 & 0x1f) & uVar55;
              if ((uVar55 >> ((uint)uVar67 & 0x1f) & 1) == 0) {
                if ((uVar43 != 0) && (uVar35 = *(ulong *)pTVar26, (uVar35 & 0x100000000) == 0)) {
                  if (((uint)uVar35 & 0xff00) == 0x100) {
                    __s[uVar35 & 0xff] = (TCGTemp *)0x0;
                    uVar35 = *(ulong *)pTVar26;
                  }
                  uVar50 = uVar35 >> 0x1c & 0x200;
                  if ((uVar35 & 0x4000000000) != 0) {
                    uVar50 = 0x200;
                  }
                  *(ulong *)pTVar26 = uVar35 & 0xffffffffffff00ff | uVar50;
                }
              }
              else {
                temp_sync(s,pTVar26,uVar22,0,uVar43);
              }
              uVar67 = uVar67 + 1;
            } while (uVar56 != uVar67);
          }
          goto LAB_009d9142;
        }
        goto LAB_009da797;
      case INDEX_op_mov_i32:
        goto switchD_009d80a8_caseD_5;
      case INDEX_op_movi_i32:
switchD_009d80a8_caseD_6:
        tcg_reg_alloc_do_movi
                  (s,*(TCGTemp **)(pTVar66 + 6),*(undefined8 *)(pTVar66 + 8),arg_life,pTVar66[0x1c])
        ;
        uVar42 = in_R9;
        goto LAB_009d9142;
      }
switchD_009d80a8_caseD_3:
      tcg_op_supported_sparc(TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
      uVar43 = TVar45 >> 0x10;
      pTVar6 = s->tcg_op_defs;
      uVar56 = (ulong)((TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
      uVar42 = (ulong)(&pTVar6->nb_oargs)[uVar56];
      bVar16 = (&pTVar6->nb_iargs)[uVar56];
      lVar49 = (ulong)(&pTVar6->nb_oargs)[uVar56] * 8;
      s_00 = (TCGContext_conflict7 *)
             ((long)&stack0xffffffffffffff08 + (ulong)((uint)bVar16 * 8) + lVar49);
      memcpy(s_00,(void *)((long)pTVar66 + (ulong)((uint)bVar16 * 8) + lVar49 + 0x18),
             (ulong)(&pTVar6->nb_cargs)[uVar56] << 3);
      TVar59 = s->reserved_regs;
      allocated_regs = TVar59;
      if (bVar16 != 0) {
        uVar67 = 0;
        do {
          lVar49 = *(long *)((long)&pTVar6->args_ct + uVar56);
          lVar64 = *(long *)((long)&pTVar6->sorted_args + uVar56);
          iVar21 = *(int *)(lVar64 + uVar67 * 4 + uVar42 * 4);
          lVar60 = (long)iVar21;
          pTVar26 = *(TCGTemp **)(pTVar66 + lVar60 * 2 + 6);
          uVar35 = *(ulong *)pTVar26;
          uVar34 = (uint)uVar35 & 0xff00;
          uVar2 = *(ushort *)(lVar49 + lVar60 * 8);
          if ((uVar34 == 0x300) &&
             ((((uVar50 = pTVar26->val, (uVar2 & 2) != 0 ||
                (((uVar2 >> 8 & 1) != 0 && (uVar50 + 0x80000000 >> 0x20 == 0)))) ||
               (((uVar2 >> 9 & 1) != 0 && (uVar50 >> 0x20 == 0)))) ||
              ((((uVar2 >> 10 & 1) != 0 && (uVar50 + 0x80000000 >> 0x20 == 0)) ||
               (((uVar2 >> 0xb & 1) != 0 &&
                ((ulong)((char)(uVar35 >> 0x18) != '\0') * 0x20 + 0x20 == uVar50)))))))) {
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar60 * 4) = 1;
            *(ulong *)((long)&stack0xffffffffffffff08 + lVar60 * 8) = uVar50;
          }
          else {
            TVar45 = INDEX_op_discard;
            if ((uVar2 & 0x40) == 0) {
              TVar18 = INDEX_op_discard;
LAB_009d892d:
              temp_load(s,pTVar26,*(TCGRegSet *)(lVar49 + 4 + lVar60 * 8),allocated_regs,TVar45);
              uVar35 = *(ulong *)pTVar26;
              bVar33 = (byte)uVar35;
              if ((*(uint *)(lVar49 + 4 + lVar60 * 8) >> ((uint)uVar35 & 0x1f) & 1) == 0)
              goto LAB_009d8961;
              uVar35 = uVar35 & 0xff;
            }
            else {
              uVar50 = (ulong)*(byte *)(lVar49 + 2 + lVar60 * 8);
              TVar18 = pTVar66[uVar50 + 0x1c];
              if ((uVar35 & 0x100000000) == 0) {
                if ((uVar43 >> ((byte)iVar21 & 0x1f) & 4) != 0) {
                  TVar45 = TVar18;
                  if ((uVar34 == 0x100) && (uVar67 != 0)) {
                    uVar50 = 0;
                    do {
                      lVar52 = (long)*(int *)(lVar64 + uVar42 * 4 + uVar50 * 4);
                      if (((*(byte *)(lVar49 + lVar52 * 8) & 0x40) != 0) &&
                         ((uVar35 & 0xff) == *(ulong *)((long)&stack0xffffffffffffff08 + lVar52 * 8)
                         )) goto LAB_009d8961;
                      uVar50 = uVar50 + 1;
                    } while (uVar67 != uVar50);
                  }
                  goto LAB_009d892d;
                }
              }
              else if (pTVar26 == *(TCGTemp **)(pTVar66 + uVar50 * 2 + 6)) goto LAB_009d892d;
LAB_009d8961:
              temp_load(s,pTVar26,s->tcg_target_available_regs[uVar35 >> 0x18 & 0xff],allocated_regs
                        ,0);
              TVar19 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar49 + 4 + lVar60 * 8),allocated_regs,TVar18
                                     ,((undefined1  [56])*pTVar26 & (undefined1  [56])0x400000000)
                                      != (undefined1  [56])0x0);
              uVar35 = (ulong)TVar19;
              tcg_out_mov(s,*(TCGReg *)pTVar26 >> 0x18,TVar19,*(TCGReg *)pTVar26 & 0xff);
              bVar33 = (byte)TVar19;
            }
            *(ulong *)((long)&stack0xffffffffffffff08 + lVar60 * 8) = uVar35;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar60 * 4) = 0;
            allocated_regs = allocated_regs | 1 << (bVar33 & 0x1f);
          }
          uVar67 = uVar67 + 1;
        } while (uVar67 != bVar16);
        s_00 = (TCGContext_conflict7 *)0x100000000;
        in_R9 = 0x200;
        uVar67 = uVar42;
        do {
          if ((uVar43 >> ((byte)uVar67 & 0x1f) & 4) != 0) {
            puVar7 = *(ulong **)(pTVar66 + uVar67 * 2 + 6);
            uVar35 = *puVar7;
            if ((uVar35 & 0x100000000) == 0) {
              if (((uint)uVar35 & 0xff00) == 0x100) {
                __s[uVar35 & 0xff] = (TCGTemp *)0x0;
                uVar35 = *puVar7;
              }
              uVar50 = uVar35 >> 0x1c & 0x200;
              if ((uVar35 & 0x4000000000) != 0) {
                uVar50 = 0x200;
              }
              *puVar7 = uVar35 & 0xffffffffffff00ff | uVar50;
            }
          }
          uVar67 = uVar67 + 1;
        } while (uVar67 < bVar16 + uVar42);
      }
      iVar21 = (int)in_R9;
      if (((&pTVar6->flags)[uVar56] & 2) == 0) {
        if (((&pTVar6->flags)[uVar56] & 4) != 0) {
          lVar49 = 0;
          do {
            s_00 = s;
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar49 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar49] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar49],allocated_regs,0,-1);
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 != 0x20);
        }
        iVar21 = (int)in_R9;
        if (uVar42 != 0) {
          uVar67 = 0;
          do {
            lVar49 = *(long *)((long)&pTVar6->args_ct + uVar56);
            lVar64 = (long)*(int *)(*(long *)((long)&pTVar6->sorted_args + uVar56) + uVar67 * 4);
            pTVar26 = *(TCGTemp **)(pTVar66 + lVar64 * 2 + 6);
            uVar2 = *(ushort *)(lVar49 + lVar64 * 8);
            if (((char)uVar2 < '\0') &&
               (uVar35 = (ulong)*(byte *)(lVar49 + 2 + lVar64 * 8),
               *(int *)((long)&stack0xffffffffffffff88 + uVar35 * 4) == 0)) {
              TVar19 = *(TCGReg *)((long)&stack0xffffffffffffff08 + uVar35 * 8);
            }
            else {
              if ((uVar2 & 0x20) == 0) {
                TVar45 = pTVar66[uVar67 + 0x1c];
                uVar34 = TVar59;
              }
              else {
                uVar34 = TVar59 | allocated_regs;
                TVar45 = pTVar66[uVar67 + 0x1c];
              }
              s_00 = s;
              TVar19 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar49 + 4 + lVar64 * 8),uVar34,TVar45,
                                     ((undefined1  [56])*pTVar26 & (undefined1  [56])0x400000000) !=
                                     (undefined1  [56])0x0);
            }
            iVar21 = (int)in_R9;
            uVar35 = *(ulong *)pTVar26;
            if (((uint)uVar35 & 0xff00) == 0x100) {
              __s[uVar35 & 0xff] = (TCGTemp *)0x0;
              uVar35 = *(ulong *)pTVar26;
            }
            TVar59 = TVar59 | 1 << (TVar19 & TCG_REG_XMM15);
            *(ulong *)pTVar26 = (uVar35 & 0xfffffff7ffff0000) + (ulong)(byte)TVar19 + 0x100;
            __s[TVar19] = pTVar26;
            *(ulong *)((long)&stack0xffffffffffffff08 + lVar64 * 8) = (ulong)TVar19;
            uVar67 = uVar67 + 1;
          } while (uVar42 != uVar67);
        }
      }
      uVar67 = local_d8;
      pTVar13 = local_e8;
      pTVar57 = local_f0;
      pTVar37 = local_f8;
      TVar45 = *pTVar66;
      r = (TCGCond)local_f8;
      bVar62 = (byte)local_f8;
      bVar16 = (byte)local_f0;
      base = (TCGCond)local_f0;
      bVar33 = (byte)local_e8;
      TVar48 = (TCGCond)local_e8;
      if (((&pTVar6->flags)[uVar56] & 0x40) == 0) {
        uVar34 = (TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) - INDEX_op_br;
        if (0x85 < uVar34) {
switchD_009d8c5b_caseD_5:
          tcg_gen_code_sparc_cold_3();
          uVar43 = s_00->nb_globals;
          uVar34 = s_00->nb_temps;
          uVar22 = uVar34 * 4 + 7;
          uVar44 = uVar34 * 4 + 0xe;
          if (-1 < (int)uVar22) {
            uVar44 = uVar22;
          }
          puVar30 = s_00->pool_cur;
          if (s_00->pool_end < puVar30 + (int)(uVar44 & 0xfffffff8)) {
            puVar30 = (uint8_t *)tcg_malloc_internal_sparc(s_00,uVar44 & 0xfffffff8);
          }
          else {
            s_00->pool_cur = puVar30 + (int)(uVar44 & 0xfffffff8);
          }
          if (0 < (int)uVar34) {
            lVar49 = (ulong)uVar34 - 1;
            auVar71._8_4_ = (int)lVar49;
            auVar71._0_8_ = lVar49;
            auVar71._12_4_ = (int)((ulong)lVar49 >> 0x20);
            lVar49 = 0;
            auVar71 = auVar71 ^ _DAT_00d58680;
            auVar72 = _DAT_00d58670;
            do {
              auVar73 = auVar72 ^ _DAT_00d58680;
              if ((bool)(~(auVar73._4_4_ == auVar71._4_4_ && auVar71._0_4_ < auVar73._0_4_ ||
                          auVar71._4_4_ < auVar73._4_4_) & 1)) {
                *(uint8_t **)((long)&s_00->temps[0].state_ptr + lVar49) = puVar30;
              }
              if ((auVar73._12_4_ != auVar71._12_4_ || auVar73._8_4_ <= auVar71._8_4_) &&
                  auVar73._12_4_ <= auVar71._12_4_) {
                *(uint8_t **)((long)&s_00->temps[1].state_ptr + lVar49) = puVar30 + 4;
              }
              lVar64 = auVar72._8_8_;
              auVar72._0_8_ = auVar72._0_8_ + 2;
              auVar72._8_8_ = lVar64 + 2;
              lVar49 = lVar49 + 0x70;
              puVar30 = puVar30 + 8;
            } while ((ulong)(uVar34 + 1 >> 1) * 0x70 - lVar49 != 0);
          }
          la_func_end(s_00,uVar43,uVar34);
          pQStackY_1d0 = ((s_00->ops).tqh_circ.tql_prev)->tql_prev;
          if ((TCGOp *)pQStackY_1d0->tql_next == (TCGOp *)0x0) goto LAB_009daffb;
          lVar49 = (ulong)uVar43 * 0x38;
          pTVar54 = (TCGOp *)pQStackY_1d0->tql_next;
          do {
            pTVar3 = (TCGOp *)((pTVar54->link).tqe_circ.tql_prev)->tql_prev->tql_next;
            uVar44 = *(uint *)pTVar54;
            uVar22 = uVar44 & 0xff;
            pQVar31 = (QTailQLink *)(ulong)uVar22;
            uVar55 = uVar22 << 5;
            pTVar6 = s_00->tcg_op_defs;
            if (uVar22 < 0x7b) {
              if (0x27 < uVar22) {
                pQVar38 = (QTailQLink *)0x13;
                if (1 < uVar22 - 0x29) {
                  if (uVar22 == 0x28) {
                    pQVar38 = (QTailQLink *)0x12;
                    goto LAB_009daa29;
                  }
                  goto switchD_009da9d0_caseD_7f;
                }
LAB_009da9eb:
                bVar16 = 2;
                bStackY_1e9 = 2;
                pQStackY_1d0 = pQVar31;
                if (*(long *)(pTVar54->args[1] + 0x28) == 1) {
                  TVar41 = pTVar54->args[0];
                  lVar64 = 0x30;
                  goto LAB_009daa3f;
                }
LAB_009daa8f:
                uStackY_1bc = (uint)bStackY_1e9;
LAB_009daa9a:
                uVar44 = (uint)bVar16;
                uVar42 = 0;
                uVar22 = 0;
                do {
                  TVar41 = pTVar54->args[uVar42];
                  pTVar9 = *(TCGRegSet **)(TVar41 + 0x30);
                  pTVar54->output_pref[uVar42] = *pTVar9;
                  uVar51 = 4 << ((byte)uVar42 & 0x1f);
                  if ((*(ulong *)(TVar41 + 0x28) & 1) == 0) {
                    uVar51 = 0;
                  }
                  uVar53 = 1 << ((byte)uVar42 & 0x1f);
                  if ((*(ulong *)(TVar41 + 0x28) & 2) == 0) {
                    uVar53 = 0;
                  }
                  uVar22 = uVar22 | uVar53 | uVar51;
                  *(undefined8 *)(TVar41 + 0x28) = 1;
                  *pTVar9 = 0;
                  uVar42 = uVar42 + 1;
                } while (bVar16 != uVar42);
                uVar42 = (ulong)bVar16;
                goto LAB_009daaf2;
              }
              if (uVar22 == 0) {
                TVar41 = pTVar54->args[0];
                *(undefined8 *)(TVar41 + 0x28) = 1;
                pQStackY_1d0 = *(QTailQLink **)(TVar41 + 0x30);
                *(undefined4 *)&pQStackY_1d0->tql_next = 0;
                goto switchD_009da9d0_caseD_81;
              }
              if (uVar22 != 2) {
                pQVar38 = (QTailQLink *)0x11;
                if (uVar22 == 0x27) goto LAB_009daa29;
                goto switchD_009da9d0_caseD_7f;
              }
              uVar22 = uVar44 >> 0xc & 0xf;
              uVar42 = (ulong)uVar22;
              uVar44 = uVar44 >> 8 & 0xf;
              TVar41 = pTVar54->args[(ulong)(uVar22 + uVar44) + 1];
              if ((TVar41 & 4) != 0) {
                if (uVar22 != 0) {
                  uVar56 = 0;
                  do {
                    if (*(long *)(pTVar54->args[uVar56] + 0x28) != 1) goto LAB_009dacb7;
                    uVar56 = uVar56 + 1;
                  } while (uVar42 != uVar56);
                }
                goto LAB_009daa46;
              }
LAB_009dacb7:
              if (uVar22 == 0) {
                uVar55 = 0;
              }
              else {
                uVar56 = 0;
                uVar55 = 0;
                do {
                  TVar4 = pTVar54->args[uVar56];
                  uVar51 = 0;
                  if ((*(ulong *)(TVar4 + 0x28) & 1) != 0) {
                    uVar51 = 4 << ((byte)uVar56 & 0x1f);
                  }
                  uVar53 = 0;
                  if ((*(ulong *)(TVar4 + 0x28) & 2) != 0) {
                    uVar53 = 1 << ((byte)uVar56 & 0x1f);
                  }
                  uVar55 = uVar55 | uVar53 | uVar51;
                  *(undefined8 *)(TVar4 + 0x28) = 1;
                  **(undefined4 **)(TVar4 + 0x30) = 0;
                  pTVar54->output_pref[uVar56] = 0;
                  uVar56 = uVar56 + 1;
                } while (uVar42 != uVar56);
              }
              uVar65 = (undefined2)uVar55;
              if ((TVar41 & 3) == 0) {
                if (0 < (int)uVar43) {
                  lVar64 = 0;
                  do {
                    *(undefined8 *)((long)&s_00->temps[0].state + lVar64) = 3;
                    **(TCGRegSet **)((long)&s_00->temps[0].state_ptr + lVar64) =
                         s_00->tcg_target_available_regs[(byte)(&s_00->temps[0].field_0x3)[lVar64]];
                    lVar64 = lVar64 + 0x38;
                  } while (lVar49 != lVar64);
                }
              }
              else if ((TVar41 & 1) == 0) {
                la_global_sync(s_00,uVar43);
              }
              uVar56 = uVar42;
              if (uVar44 == 0) {
                la_cross_call(s_00,uVar34);
                pQStackY_1d0 = extraout_RAX_01;
              }
              else {
                do {
                  if ((pTVar54->args[uVar56] != 0) &&
                     ((*(byte *)(pTVar54->args[uVar56] + 0x28) & 1) != 0)) {
                    uVar55 = uVar55 | 4 << ((byte)uVar56 & 0x1f);
                  }
                  uVar65 = (undefined2)uVar55;
                  uVar56 = uVar56 + 1;
                } while (uVar56 < uVar22 + uVar44);
                la_cross_call(s_00,uVar34);
                pQStackY_1d0 = extraout_RAX_00;
                if (uVar44 != 0) {
                  pQStackY_1d0 = (QTailQLink *)(pTVar54->args + uVar42);
                  uVar42 = 0;
                  do {
                    pvVar11 = (&pQStackY_1d0->tql_next)[uVar42];
                    if ((pvVar11 != (void *)0x0) &&
                       (uVar56 = *(ulong *)((long)pvVar11 + 0x28), (uVar56 & 1) != 0)) {
                      TVar59 = 0;
                      if (5 < uVar42) {
                        TVar59 = s_00->tcg_target_available_regs[*(byte *)((long)pvVar11 + 3)];
                      }
                      **(TCGRegSet **)((long)pvVar11 + 0x30) = TVar59;
                      *(ulong *)((long)pvVar11 + 0x28) = uVar56 & 0xfffffffffffffffe;
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar44 != uVar42);
                  if (uVar44 != 0) {
                    if (5 < uVar44) {
                      uVar44 = 6;
                    }
                    uVar42 = 0;
                    do {
                      lVar64 = *(long *)((long)&pQStackY_1d0->tql_next + uVar42 * 2);
                      if (lVar64 != 0) {
                        puVar10 = *(uint **)(lVar64 + 0x30);
                        *puVar10 = *puVar10 |
                                   1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar42) & 0x1f)
                        ;
                      }
                      uVar42 = uVar42 + 4;
                    } while (uVar44 << 2 != uVar42);
                  }
                }
              }
            }
            else {
              if (uVar22 - 0x7b < 7) {
                pQStackY_1d0 = (QTailQLink *)
                               ((long)&switchD_009da9d0::switchdataD_00da30c8 +
                               (long)(int)(&switchD_009da9d0::switchdataD_00da30c8)[uVar22 - 0x7b]);
                switch(uVar22) {
                case 0x7b:
                  pQVar38 = (QTailQLink *)0x4e;
                  break;
                case 0x7c:
                  pQVar38 = (QTailQLink *)0x4f;
                  break;
                default:
                  pQVar38 = (QTailQLink *)0x50;
                  goto LAB_009da9eb;
                case 0x7f:
                case 0x80:
                  goto switchD_009da9d0_caseD_7f;
                case 0x81:
                  goto switchD_009da9d0_caseD_81;
                }
LAB_009daa29:
                if (*(long *)(pTVar54->args[1] + 0x28) == 1) {
                  TVar41 = pTVar54->args[0];
                  lVar64 = 0x38;
LAB_009daa3f:
                  if (*(long *)(TVar41 + 0x28) == 1) goto LAB_009daa46;
                  *(uint *)pTVar54 = uVar44 & 0xffffff00 | (uint)pQVar38;
                  pTVar54->args[1] = pTVar54->args[2];
                  pTVar54->args[2] = *(TCGArg *)((long)pTVar54->args + lVar64 + -0x18);
                  bStackY_1e9 = 2;
                  bVar16 = 1;
                  pQStackY_1d0 = pQVar38;
                }
                else {
                  bStackY_1e9 = 4;
                  bVar16 = 2;
                  pQStackY_1d0 = pQVar31;
                }
                goto LAB_009daa8f;
              }
switchD_009da9d0_caseD_7f:
              bVar16 = (&pTVar6->nb_oargs)[uVar55];
              bStackY_1e9 = (&pTVar6->nb_iargs)[uVar55];
              if (bVar16 != 0 && ((&pTVar6->flags)[uVar55] & 8) == 0) {
                uVar42 = 0;
                do {
                  if (*(long *)(pTVar54->args[uVar42] + 0x28) != 1) goto LAB_009dae43;
                  uVar42 = uVar42 + 1;
                } while (bVar16 != uVar42);
LAB_009daa46:
                tcg_op_remove_sparc(s_00,pTVar54);
                pQStackY_1d0 = extraout_RAX;
switchD_009da9d0_caseD_81:
                uVar65 = 0;
                goto LAB_009dad4e;
              }
LAB_009dae43:
              uStackY_1bc = (uint)bStackY_1e9;
              pQStackY_1d0 = pQVar31;
              if (bVar16 != 0) goto LAB_009daa9a;
              uVar44 = 0;
              uVar42 = 0;
              uVar22 = 0;
LAB_009daaf2:
              bVar16 = (&pTVar6->flags)[uVar55];
              if ((bVar16 & 1) == 0) {
                if ((bVar16 & 2) == 0) {
                  if (((bVar16 & 8) != 0) &&
                     (la_global_sync(s_00,uVar43), ((&pTVar6->flags)[uVar55] & 4) != 0)) {
                    la_cross_call(s_00,uVar34);
                  }
                }
                else if ((int)pQStackY_1d0 == 0x26) {
                  if (0 < (int)uVar43) {
                    lVar64 = 0;
                    do {
                      pbVar28 = (byte *)((long)&s_00->temps[0].state + lVar64);
                      *pbVar28 = *pbVar28 | 2;
                      lVar64 = lVar64 + 0x38;
                    } while (lVar49 != lVar64);
                  }
                }
                else {
                  if (0 < (int)uVar43) {
                    lVar64 = 0;
                    do {
                      *(undefined8 *)((long)&s_00->temps[0].state + lVar64) = 3;
                      **(TCGRegSet **)((long)&s_00->temps[0].state_ptr + lVar64) =
                           s_00->tcg_target_available_regs
                           [(byte)(&s_00->temps[0].field_0x3)[lVar64]];
                      lVar64 = lVar64 + 0x38;
                    } while (lVar49 != lVar64);
                  }
                  ppvVar32 = &s_00->temps[(int)uVar43].state_ptr;
                  lVar64 = (long)(int)uVar34 - (long)(int)uVar43;
                  if ((int)uVar43 < (int)uVar34) {
                    do {
                      uVar56 = *(ulong *)(ppvVar32 + -6) & 0x4000000000;
                      TVar59 = 0;
                      ppvVar32[-1] = (void *)((uVar56 >> 0x26) * 2 + 1);
                      if (uVar56 != 0) {
                        TVar59 = s_00->tcg_target_available_regs
                                 [*(ulong *)(ppvVar32 + -6) >> 0x18 & 0xff];
                      }
                      *(TCGRegSet *)*ppvVar32 = TVar59;
                      ppvVar32 = ppvVar32 + 7;
                      lVar64 = lVar64 + -1;
                    } while (lVar64 != 0);
                  }
                }
              }
              else {
                la_func_end(s_00,uVar43,uVar34);
              }
              uVar44 = uVar44 + uStackY_1bc;
              if (bStackY_1e9 != 0) {
                uVar56 = uVar42;
                do {
                  uVar51 = 0;
                  if ((*(byte *)(pTVar54->args[uVar56] + 0x28) & 1) != 0) {
                    uVar51 = 4 << ((byte)uVar56 & 0x1f);
                  }
                  uVar22 = uVar22 | uVar51;
                  uVar56 = uVar56 + 1;
                } while (uVar56 < uVar44);
                uVar56 = uVar42;
                if (bStackY_1e9 != 0) {
                  do {
                    TVar41 = pTVar54->args[uVar56];
                    uVar67 = *(ulong *)(TVar41 + 0x28);
                    if ((uVar67 & 1) != 0) {
                      **(TCGRegSet **)(TVar41 + 0x30) =
                           s_00->tcg_target_available_regs[*(byte *)(TVar41 + 3)];
                      *(ulong *)(TVar41 + 0x28) = uVar67 & 0xfffffffffffffffe;
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 < uVar44);
                }
              }
              uVar65 = (undefined2)uVar22;
              if (((int)pQStackY_1d0 == 5) || ((int)pQStackY_1d0 == 0x3f)) {
                if ((uVar22 & 8) != 0) {
                  pQStackY_1d0 = *(QTailQLink **)(pTVar54->args[0] + 0x30);
                  *(undefined4 *)&pQStackY_1d0->tql_next =
                       **(undefined4 **)(pTVar54->args[1] + 0x30);
                }
              }
              else if (bStackY_1e9 != 0) {
                pQStackY_1d0 = *(QTailQLink **)((long)&pTVar6->args_ct + (ulong)uVar55);
                do {
                  puVar10 = *(uint **)(pTVar54->args[uVar42] + 0x30);
                  uVar22 = *(uint *)((long)&pQStackY_1d0->tql_next + uVar42 * 8 + 4);
                  uVar55 = *puVar10 & uVar22;
                  if (((ulong)(&pQStackY_1d0->tql_next)[uVar42] & 0x40) != 0) {
                    uVar55 = uVar55 & pTVar54->output_pref
                                      [*(byte *)((long)&pQStackY_1d0->tql_next + uVar42 * 8 + 2)];
                  }
                  if (uVar55 != 0) {
                    uVar22 = uVar55;
                  }
                  *puVar10 = uVar22;
                  uVar42 = uVar42 + 1;
                } while (uVar42 < uVar44);
              }
            }
LAB_009dad4e:
            *(undefined2 *)&pTVar54->field_0x2 = uVar65;
            pTVar54 = pTVar3;
            if (pTVar3 == (TCGOp *)0x0) {
LAB_009daffb:
              return (int)pQStackY_1d0;
            }
          } while( true );
        }
        iVar20 = 0x402f7;
        opc = 0xf7;
        iVar21 = 5;
        rexw = TCG_TYPE_I32;
        TVar47 = TCG_TYPE_I32;
        iVar63 = 0;
        type = TCG_TYPE_I32;
        uVar44 = 0;
        src = (int)local_d8;
        TVar15 = TCG_TYPE_I32;
        iVar40 = 5;
        switch(TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) {
        case INDEX_op_br:
          tcg_out_jxx(s,-1,local_f8,(&switchD_009d8c5b::switchdataD_00da2e90)[uVar34] + 0xda2e90);
          break;
        case INDEX_op_mb:
          tcg_out_mb(s,(TCGArg)local_f8);
          break;
        default:
          goto switchD_009d8c5b_caseD_5;
        case INDEX_op_setcond_i32:
          tcg_out_setcond32(s,_local_e0,(TCGArg)local_f8,(TCGArg)local_f0,(TCGArg)local_e8,local_70)
          ;
          break;
        case INDEX_op_movcond_i32:
          in_stack_fffffffffffffe98 = (TCGLabel *)(ulong)_local_e0;
          tcg_out_movcond32(s,local_d0,r,base,(TCGArg)local_e8,local_70,_local_e0);
          break;
        case INDEX_op_ld8u_i32:
        case INDEX_op_ld8u_i64:
          iVar21 = 0x1b6;
          goto LAB_009d9dcd;
        case INDEX_op_ld8s_i32:
          iVar21 = 0x1be;
          goto LAB_009d9dcd;
        case INDEX_op_ld16u_i32:
        case INDEX_op_ld16u_i64:
          iVar21 = 0x1b7;
          goto LAB_009d9dcd;
        case INDEX_op_ld16s_i32:
          iVar21 = 0x1bf;
          goto LAB_009d9dcd;
        case INDEX_op_ld_i32:
        case INDEX_op_ld32u_i64:
          TVar47 = TCG_TYPE_I32;
          goto LAB_009d9ebf;
        case INDEX_op_st8_i32:
        case INDEX_op_st8_i64:
          if (local_78 == 0) {
            iVar21 = 0x2088;
            goto LAB_009d9dcd;
          }
          tcg_out_modrm_offset(s,0xc6,0,base,(intptr_t)local_e8);
          goto LAB_009d9dab;
        case INDEX_op_st16_i32:
        case INDEX_op_st16_i64:
          if (local_78 == 0) {
            iVar21 = 0x489;
            goto LAB_009d9dcd;
          }
          tcg_out_modrm_offset(s,0x4c7,0,base,(intptr_t)local_e8);
          ptVar29 = s->code_ptr;
          *(short *)ptVar29 = (short)pTVar37;
          pTVar27 = (TCGCond *)(ptVar29 + 2);
LAB_009d9e9e:
          s->code_ptr = (tcg_insn_unit *)pTVar27;
          break;
        case INDEX_op_st_i32:
        case INDEX_op_st32_i64:
          if (local_78 != 0) {
            iVar21 = 199;
LAB_009d9e80:
            tcg_out_modrm_offset(s,iVar21,0,base,(intptr_t)local_e8);
            pTVar27 = (TCGCond *)s->code_ptr;
            *pTVar27 = r;
            pTVar27 = pTVar27 + 1;
            goto LAB_009d9e9e;
          }
          TVar47 = TCG_TYPE_I32;
          goto LAB_009da361;
        case INDEX_op_add_i32:
          goto switchD_009d8c5b_caseD_11;
        case INDEX_op_sub_i32:
          goto switchD_009d8c5b_caseD_12;
        case INDEX_op_mul_i32:
          goto switchD_009d8c5b_caseD_13;
        case INDEX_op_div2_i32:
          goto switchD_009d8c5b_caseD_18;
        case INDEX_op_divu2_i32:
          goto switchD_009d8c5b_caseD_19;
        case INDEX_op_and_i32:
          iVar21 = 4;
          rexw = TCG_TYPE_I32;
          goto switchD_009d8c5b_caseD_12;
        case INDEX_op_or_i32:
          iVar21 = 1;
          goto switchD_009d8c5b_caseD_12;
        case INDEX_op_xor_i32:
          iVar21 = 6;
          goto switchD_009d8c5b_caseD_12;
        case INDEX_op_shl_i32:
          goto switchD_009d8c5b_caseD_1d;
        case INDEX_op_shr_i32:
          goto switchD_009d8c5b_caseD_1e;
        case INDEX_op_sar_i32:
          TVar47 = TCG_TYPE_I32;
          goto LAB_009d99df;
        case INDEX_op_rotl_i32:
          goto switchD_009d8c5b_caseD_20;
        case INDEX_op_rotr_i32:
          iVar63 = 1;
switchD_009d8c5b_caseD_20:
          TVar47 = TCG_TYPE_I32;
          goto LAB_009d9fad;
        case INDEX_op_deposit_i32:
        case INDEX_op_deposit_i64:
          if (CONCAT44(uStack_dc,_local_e0) == 8) {
            if (local_d8 != 8) goto LAB_009da7dc;
            uVar34 = r + TCG_COND_LTU >> 3 & 1 | (uint)((ulong)local_e8 >> 1) & 4;
            pbVar28 = s->code_ptr;
            if (uVar34 != 0) {
              s->code_ptr = pbVar28 + 1;
              *pbVar28 = (byte)uVar34 | 0x40;
              pbVar28 = s->code_ptr;
            }
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = 0x88;
            pbVar28 = s->code_ptr;
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = ((byte)(r + TCG_COND_LTU) & 7) + bVar33 * '\b' | 0xc0;
          }
          else {
            if (CONCAT44(uStack_dc,_local_e0) != 0) {
LAB_009da7dc:
              tcg_gen_code_sparc_cold_2();
              goto LAB_009da7e1;
            }
            if (local_d8 == 0x10) {
              iVar21 = 0x489;
            }
            else {
              if (local_d8 != 8) goto LAB_009da7dc;
              iVar21 = 0x6088;
            }
            tcg_out_opc(s,iVar21,TVar48,r,0);
            pbVar28 = s->code_ptr;
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = (bVar62 & 7) + bVar33 * '\b' | 0xc0;
          }
          break;
        case INDEX_op_extract_i32:
switchD_009d8c5b_caseD_23:
          if (local_f8 < (TCGLabel *)0x8 && local_f0 < (TCGLabel *)0x4) {
            iVar21 = 0x1b6;
            goto LAB_009d9bd8;
          }
          tcg_out_ext16u(s,r,base);
          iVar63 = 5;
LAB_009da2a4:
          TVar48 = TCG_COND_EQ;
          goto LAB_009d9fc7;
        case INDEX_op_sextract_i32:
          if ((TCGLabel *)0x7 < local_f8 || (TCGLabel *)0x3 < local_f0) {
            tcg_out_opc(s,0x1bf,r,base,0);
            pbVar28 = s->code_ptr;
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = (bVar16 & 7) + bVar62 * '\b' | 0xc0;
            iVar63 = 7;
            goto LAB_009da2a4;
          }
          iVar21 = 0x1be;
LAB_009d9bd8:
          tcg_out_opc(s,iVar21,r,base | TCG_COND_LTU,0);
          bVar16 = bVar16 + bVar62 * '\b' + 4;
          goto LAB_009d96df;
        case INDEX_op_extract2_i32:
          iVar21 = 0x1ac;
          goto LAB_009d9aa2;
        case INDEX_op_brcond_i32:
          tcg_out_brcond32(s,TVar48,(TCGArg)local_f8,(TCGArg)local_f0,local_74,
                           (TCGLabel *)CONCAT44(uStack_dc,_local_e0),(int)in_stack_fffffffffffffe98)
          ;
          break;
        case INDEX_op_add2_i32:
          goto switchD_009d8c5b_caseD_27;
        case INDEX_op_sub2_i32:
          goto switchD_009d8c5b_caseD_28;
        case INDEX_op_mulu2_i32:
          goto switchD_009d8c5b_caseD_29;
        case INDEX_op_muls2_i32:
          goto switchD_009d8c5b_caseD_2a;
        case INDEX_op_ext8s_i32:
          goto switchD_009d8c5b_caseD_2f;
        case INDEX_op_ext16s_i32:
          goto switchD_009d8c5b_caseD_30;
        case INDEX_op_ext8u_i32:
        case INDEX_op_ext8u_i64:
          tcg_out_ext8u(s,r,base);
          break;
        case INDEX_op_ext16u_i32:
        case INDEX_op_ext16u_i64:
          tcg_out_ext16u(s,r,base);
          break;
        case INDEX_op_bswap16_i32:
        case INDEX_op_bswap16_i64:
          tcg_out_rolw_8(s,r);
          break;
        case INDEX_op_bswap32_i32:
        case INDEX_op_bswap32_i64:
          TVar48 = r & (TCG_COND_LTU|TCG_COND_GE) | 0x1c8;
          goto LAB_009d9b20;
        case INDEX_op_not_i32:
          goto switchD_009d8c5b_caseD_35;
        case INDEX_op_neg_i32:
          goto switchD_009d8c5b_caseD_36;
        case INDEX_op_andc_i32:
          uVar34 = 0;
          goto LAB_009d9cd5;
        case INDEX_op_clz_i32:
          goto switchD_009d8c5b_caseD_3c;
        case INDEX_op_ctz_i32:
          goto switchD_009d8c5b_caseD_3d;
        case INDEX_op_ctpop_i32:
          uVar44 = 0x201b8;
          TVar48 = base;
          goto LAB_009d9e58;
        case INDEX_op_setcond_i64:
          tcg_out_setcond64(s,_local_e0,(TCGArg)local_f8,(TCGArg)local_f0,(TCGArg)local_e8,local_70)
          ;
          break;
        case INDEX_op_movcond_i64:
          in_stack_fffffffffffffe98 = (TCGLabel *)(ulong)_local_e0;
          tcg_out_movcond64(s,local_d0,r,base,(TCGArg)local_e8,local_70,_local_e0);
          break;
        case INDEX_op_ld8s_i64:
          iVar21 = 0x11be;
          goto LAB_009d9dcd;
        case INDEX_op_ld16s_i64:
          iVar21 = 0x11bf;
          goto LAB_009d9dcd;
        case INDEX_op_ld32s_i64:
          iVar21 = 0x1063;
LAB_009d9dcd:
          tcg_out_modrm_offset(s,iVar21,r,base,(intptr_t)local_e8);
          break;
        case INDEX_op_ld_i64:
          TVar47 = TCG_TYPE_I64;
LAB_009d9ebf:
          tcg_out_ld(s,TVar47,r,base,(intptr_t)local_e8);
          break;
        case INDEX_op_st_i64:
          if (local_78 != 0) {
            iVar21 = 0x10c7;
            goto LAB_009d9e80;
          }
          TVar47 = TCG_TYPE_I64;
LAB_009da361:
          tcg_out_st(s,TVar47,r,base,(intptr_t)local_e8);
          break;
        case INDEX_op_add_i64:
          rexw = 0x1000;
switchD_009d8c5b_caseD_11:
          iVar21 = 0;
          if (local_f8 == local_f0) goto switchD_009d8c5b_caseD_12;
          if (local_70 == 0) {
            if (local_f8 == local_e8) {
              pTVar37 = (TCGLabel *)((ulong)local_f0 & 0xffffffff);
LAB_009da168:
              tgen_arithr(s,rexw,r,(int)pTVar37);
              break;
            }
            in_stack_fffffffffffffe98 = (TCGLabel *)0x0;
            pTVar37 = local_e8;
          }
          else {
            in_stack_fffffffffffffe98 = local_e8;
            pTVar37 = (TCGLabel *)0xffffffffffffffff;
          }
          TVar47 = rexw | 0x8d;
LAB_009da3d0:
          TVar48 = TCG_COND_NEVER;
LAB_009da3d3:
          tcg_out_modrm_sib_offset
                    (s,TVar47,r,base,(int)pTVar37,TVar48,(intptr_t)in_stack_fffffffffffffe98);
          break;
        case INDEX_op_sub_i64:
          goto switchD_009d8c5b_caseD_4f;
        case INDEX_op_mul_i64:
          uVar44 = 0x1000;
switchD_009d8c5b_caseD_13:
          if (local_70 == 0) {
            uVar44 = uVar44 | 0x1af;
            pTVar57 = local_e8;
            goto LAB_009d9e58;
          }
          bVar16 = (bVar62 & 7) + bVar62 * '\b' | 0xc0;
          if (TVar48 != (int)(char)bVar33) {
            tcg_out_opc(s,uVar44 | 0x69,r,r,0);
            pbVar28 = s->code_ptr;
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = bVar16;
            pTVar27 = (TCGCond *)s->code_ptr;
            *pTVar27 = TVar48;
            s->code_ptr = (tcg_insn_unit *)(pTVar27 + 1);
            break;
          }
          tcg_out_opc(s,uVar44 | 0x6b,r,r,0);
          pbVar28 = s->code_ptr;
          s->code_ptr = pbVar28 + 1;
          *pbVar28 = bVar16;
          pbVar28 = s->code_ptr;
          s->code_ptr = pbVar28 + 1;
          goto LAB_009d92ea;
        case INDEX_op_div2_i64:
          opc = 0x10f7;
switchD_009d8c5b_caseD_18:
          tcg_out_opc(s,opc,7,src,0);
          pTVar37 = (TCGLabel *)(uVar67 | 0xf8);
LAB_009d9dab:
          ptVar29 = s->code_ptr;
          s->code_ptr = ptVar29 + 1;
          *ptVar29 = (tcg_insn_unit)pTVar37;
          break;
        case INDEX_op_divu2_i64:
          opc = 0x10f7;
switchD_009d8c5b_caseD_19:
          tcg_out_opc(s,opc,6,src,0);
          pTVar37 = (TCGLabel *)(uVar67 & 0xffffffffffffff07 | 0xf0);
          goto LAB_009d9dab;
        case INDEX_op_and_i64:
          iVar40 = 4;
          goto switchD_009d8c5b_caseD_4f;
        case INDEX_op_or_i64:
          iVar40 = 1;
          goto switchD_009d8c5b_caseD_4f;
        case INDEX_op_xor_i64:
          iVar40 = 6;
switchD_009d8c5b_caseD_4f:
          iVar21 = iVar40;
          rexw = 0x1000;
switchD_009d8c5b_caseD_12:
          rexw = rexw + iVar21;
          if (local_70 != 0) {
            iVar21 = 0;
            pTVar37 = local_e8;
LAB_009da15e:
            tgen_arithi(s,rexw,r,(tcg_target_long)pTVar37,iVar21);
            break;
          }
          uVar44 = (rexw & ~(TCG_TYPE_V256|TCG_TYPE_V128)) +
                   (rexw & (TCG_TYPE_V256|TCG_TYPE_V128)) * 8 + 3;
          pTVar57 = local_e8;
LAB_009d9e58:
          tcg_out_opc(s,uVar44,r,TVar48,0);
LAB_009d9e5d:
          bVar16 = ((byte)pTVar57 & 7) + bVar62 * '\b';
          goto LAB_009d96df;
        case INDEX_op_shl_i64:
          TVar15 = 0x1000;
switchD_009d8c5b_caseD_1d:
          TVar47 = TVar15;
          iVar20 = 0x6f7;
          iVar21 = 4;
          if ((local_f8 == local_f0 || local_70 == 0) ||
             (&DAT_00000002 < (undefined1 *)((long)&local_e8[-1].next.sqe_next + 7)))
          goto switchD_009d8c5b_caseD_1e;
          TVar47 = TVar47 | 0x8d;
          pTVar37 = local_f0;
          if (local_e8 == (TCGLabel *)&DAT_00000001) {
            in_stack_fffffffffffffe98 = (TCGLabel *)0x0;
            goto LAB_009da3d0;
          }
          in_stack_fffffffffffffe98 = (TCGLabel *)0x0;
          base = ~TCG_COND_NEVER;
          goto LAB_009da3d3;
        case INDEX_op_shr_i64:
          TVar47 = 0x1000;
          goto switchD_009d8c5b_caseD_1e;
        case INDEX_op_sar_i64:
          TVar47 = 0x1000;
LAB_009d99df:
          iVar20 = 0x202f7;
          iVar21 = 7;
switchD_009d8c5b_caseD_1e:
          iVar63 = iVar21;
          if (have_bmi2 == true) {
            if (local_70 != 0) {
              tcg_out_mov(s,(uint)(TVar47 != TCG_TYPE_I32),r,base);
              goto LAB_009d9fb8;
            }
            tcg_out_vex_opc(s,TVar47 + iVar20,r,TVar48,base,0);
            goto LAB_009d9e5d;
          }
LAB_009d9fad:
          if (local_70 != 0) {
LAB_009d9fb8:
            iVar63 = iVar63 + TVar47;
            goto LAB_009d9fc7;
          }
          tcg_out_opc(s,TVar47 + 0xd3,iVar63,r,0);
          bVar16 = (bVar62 & 7) + (char)iVar63 * '\b';
          goto LAB_009d96df;
        case INDEX_op_rotl_i64:
          goto switchD_009d8c5b_caseD_5d;
        case INDEX_op_rotr_i64:
          iVar63 = 1;
switchD_009d8c5b_caseD_5d:
          TVar47 = 0x1000;
          goto LAB_009d9fad;
        case INDEX_op_extract_i64:
          if (&local_e8->field_0x0 + CONCAT44(uStack_dc,_local_e0) != (undefined1 *)0x20)
          goto switchD_009d8c5b_caseD_23;
          tcg_out_mov(s,TCG_TYPE_I32,r,base);
          iVar63 = 5;
          goto LAB_009d9fc7;
        case INDEX_op_extract2_i64:
          iVar21 = 0x11ac;
LAB_009d9aa2:
          tcg_out_opc(s,iVar21,TVar48,r,0);
          pbVar28 = s->code_ptr;
          s->code_ptr = pbVar28 + 1;
          *pbVar28 = (bVar62 & 7) + bVar33 * '\b' | 0xc0;
          ptVar29 = s->code_ptr;
          s->code_ptr = ptVar29 + 1;
          *ptVar29 = local_e0;
          break;
        case INDEX_op_ext_i32_i64:
        case INDEX_op_ext32s_i64:
          tcg_out_ext32s(s,r,base);
          break;
        case INDEX_op_extu_i32_i64:
        case INDEX_op_extrl_i64_i32:
        case INDEX_op_ext32u_i64:
          uVar34 = (uint)((ulong)local_f0 >> 3) & 1 | (uint)((ulong)local_f8 >> 1) & 4;
          pbVar28 = s->code_ptr;
          if (uVar34 != 0) {
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = (byte)uVar34 | 0x40;
            pbVar28 = s->code_ptr;
          }
          s->code_ptr = pbVar28 + 1;
          *pbVar28 = 0x8b;
          pbVar28 = s->code_ptr;
          s->code_ptr = pbVar28 + 1;
          *pbVar28 = (bVar16 & 7) + bVar62 * '\b' | 0xc0;
          break;
        case INDEX_op_extrh_i64_i32:
          iVar63 = 0x1005;
          TVar48 = 0x20;
LAB_009d9fc7:
          tcg_out_shifti(s,iVar63,r,TVar48);
          break;
        case INDEX_op_brcond_i64:
          tcg_out_brcond64(s,TVar48,(TCGArg)local_f8,(TCGArg)local_f0,local_74,
                           (TCGLabel *)CONCAT44(uStack_dc,_local_e0),(int)in_stack_fffffffffffffe98)
          ;
          break;
        case INDEX_op_ext8s_i64:
          type = 0x1000;
switchD_009d8c5b_caseD_2f:
          tcg_out_ext8s(s,r,base,type);
          break;
        case INDEX_op_ext16s_i64:
          type = 0x1000;
switchD_009d8c5b_caseD_30:
          tcg_out_ext16s(s,r,base,type);
          break;
        case INDEX_op_bswap64_i64:
          TVar48 = r & (TCG_COND_LTU|TCG_COND_GE) | 0x11c8;
LAB_009d9b20:
          tcg_out_opc(s,TVar48,0,r,0);
          break;
        case INDEX_op_not_i64:
          opc = 0x10f7;
switchD_009d8c5b_caseD_35:
          tcg_out_opc(s,opc,2,r,0);
          pTVar37 = (TCGLabel *)((ulong)pTVar37 & 0xffffffffffffff07 | 0xd0);
          goto LAB_009d9dab;
        case INDEX_op_neg_i64:
          opc = 0x10f7;
switchD_009d8c5b_caseD_36:
          tcg_out_opc(s,opc,3,r,0);
          pTVar37 = (TCGLabel *)((ulong)pTVar37 & 0xffffffffffffff07 | 0xd8);
          goto LAB_009d9dab;
        case INDEX_op_andc_i64:
          uVar34 = 0x1000;
          type = TCG_TYPE_I64;
LAB_009d9cd5:
          if (local_70 == 0) {
            tcg_out_vex_opc(s,uVar34 | 0x2f2,r,TVar48,base,0);
            pbVar28 = s->code_ptr;
            s->code_ptr = pbVar28 + 1;
            *pbVar28 = (bVar16 & 7) + bVar62 * '\b' | 0xc0;
          }
          else {
            tcg_out_mov(s,type,r,base);
            tgen_arithi(s,uVar34 | 4,r,~(ulong)pTVar13,0);
          }
          break;
        case INDEX_op_clz_i64:
          rexw = 0x1000;
switchD_009d8c5b_caseD_3c:
          tcg_out_clz(s,rexw,r,base,(TCGArg)local_e8,local_70 != 0);
          break;
        case INDEX_op_ctz_i64:
          rexw = 0x1000;
switchD_009d8c5b_caseD_3d:
          tcg_out_ctz(s,rexw,r,base,(TCGArg)local_e8,local_70 != 0);
          break;
        case INDEX_op_ctpop_i64:
          uVar44 = 0x211b8;
          TVar48 = base;
          goto LAB_009d9e58;
        case INDEX_op_add2_i64:
          type = 0x1000;
switchD_009d8c5b_caseD_27:
          if (local_68 == 0) {
            tgen_arithr(s,type,r,src);
          }
          else {
            tgen_arithi(s,type,r,local_d8,1);
          }
          rexw = type | TCG_TYPE_V64;
LAB_009da13d:
          pTVar37 = (TCGLabel *)CONCAT44(uStack_cc,local_d0);
          r = base;
          if (local_64 != 0) {
            iVar21 = 1;
            goto LAB_009da15e;
          }
          goto LAB_009da168;
        case INDEX_op_sub2_i64:
          type = 0x1000;
switchD_009d8c5b_caseD_28:
          if (local_68 == 0) {
            tgen_arithr(s,type | TCG_TYPE_COUNT,r,src);
          }
          else {
            tgen_arithi(s,type | TCG_TYPE_COUNT,r,local_d8,1);
          }
          rexw = type | TCG_TYPE_V128;
          goto LAB_009da13d;
        case INDEX_op_mulu2_i64:
          opc = 0x10f7;
switchD_009d8c5b_caseD_29:
          uVar56 = CONCAT44(uStack_dc,_local_e0);
          tcg_out_opc(s,opc,4,_local_e0,0);
          pTVar37 = (TCGLabel *)(uVar56 & 0xffffffffffffff07 | 0xe0);
          goto LAB_009d9dab;
        case INDEX_op_muls2_i64:
          opc = 0x10f7;
switchD_009d8c5b_caseD_2a:
          uVar56 = CONCAT44(uStack_dc,_local_e0);
          tcg_out_opc(s,opc,5,_local_e0,0);
          pTVar37 = (TCGLabel *)(uVar56 & 0xffffffffffffff07 | 0xe8);
          goto LAB_009d9dab;
        case INDEX_op_exit_tb:
          if (local_f8 == (TCGLabel *)0x0) {
            ptVar29 = (tcg_insn_unit *)s->code_gen_epilogue;
          }
          else {
            tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_EAX,(tcg_target_long)local_f8);
            ptVar29 = (tcg_insn_unit *)s->tb_ret_addr;
          }
          tcg_out_branch(s,0,ptVar29);
          break;
        case INDEX_op_goto_tb:
          if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
            tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + (long)local_f8));
          }
          else {
            ptVar29 = s->code_ptr;
            iVar21 = (int)ptVar29;
            iVar40 = (iVar21 + 4U & 0xfffffffc) - iVar21;
            if (iVar40 != 1) {
              if (1 < iVar40 - 1U) {
                iVar21 = (iVar21 - (iVar21 + 4U & 0xfffffffc)) + 2;
                do {
                  ptVar29 = s->code_ptr;
                  s->code_ptr = ptVar29 + 1;
                  *ptVar29 = 'f';
                  iVar21 = iVar21 + 1;
                } while (iVar21 != 0);
                ptVar29 = s->code_ptr;
              }
              s->code_ptr = ptVar29 + 1;
              *ptVar29 = 0x90;
              ptVar29 = s->code_ptr;
            }
            s->code_ptr = ptVar29 + 1;
            *ptVar29 = 0xe9;
            ptVar29 = s->code_ptr;
            s->tb_jmp_insn_offset[(long)local_f8] = (long)ptVar29 - (long)s->code_buf;
            ptVar29[0] = '\0';
            ptVar29[1] = '\0';
            ptVar29[2] = '\0';
            ptVar29[3] = '\0';
            s->code_ptr = ptVar29 + 4;
          }
          set_jmp_reset_offset(s,r);
          break;
        case INDEX_op_goto_ptr:
          ptVar29 = s->code_ptr;
          if (((ulong)local_f8 & 8) != 0) {
            s->code_ptr = ptVar29 + 1;
            *ptVar29 = 'A';
            ptVar29 = s->code_ptr;
          }
          s->code_ptr = ptVar29 + 1;
          *ptVar29 = 0xff;
          pbVar28 = s->code_ptr;
          s->code_ptr = pbVar28 + 1;
          *pbVar28 = bVar62 & 7 | 0xe0;
          break;
        case INDEX_op_qemu_ld_i32:
          _Var17 = false;
          goto LAB_009da024;
        case INDEX_op_qemu_st_i32:
          _Var17 = false;
          goto LAB_009da038;
        case INDEX_op_qemu_ld_i64:
          _Var17 = true;
LAB_009da024:
          tcg_out_qemu_ld(s,(TCGArg *)&stack0xffffffffffffff08,_Var17);
          break;
        case INDEX_op_qemu_st_i64:
          _Var17 = true;
LAB_009da038:
          tcg_out_qemu_st(s,(TCGArg *)&stack0xffffffffffffff08,_Var17);
        }
        goto LAB_009d9709;
      }
      if (0x2b < (TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) - INDEX_op_ld_vec) {
switchD_009d8e42_caseD_93:
        pcVar23 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
        ;
        iVar21 = 0xb75;
LAB_009da7c7:
        g_assertion_message_expr(pcVar23,iVar21,(char *)0x0);
      }
      uVar34 = TVar45 >> 0xc & 0xf;
      uVar56 = (ulong)uVar34;
      TVar47 = (TVar45 >> 8 & 0xf) + TCG_TYPE_V64;
      pTVar37 = local_e8;
      switch(TVar45 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) {
      case INDEX_op_ld_vec:
        tcg_out_ld(s,TVar47,r,base,(intptr_t)local_e8);
        goto LAB_009d9709;
      case INDEX_op_st_vec:
        tcg_out_st(s,TVar47,r,base,(intptr_t)local_e8);
        goto LAB_009d9709;
      case INDEX_op_dupm_vec:
        tcg_out_dupm_vec(s,TVar47,uVar34,r,base,(intptr_t)local_e8);
        goto LAB_009d9709;
      case INDEX_op_add_vec:
        uVar34 = *(uint *)(tcg_out_vec_op_add_insn + uVar56 * 4);
        goto LAB_009d96bb;
      case INDEX_op_sub_vec:
        puVar36 = tcg_out_vec_op_sub_insn;
        break;
      case INDEX_op_mul_vec:
        puVar36 = tcg_out_vec_op_mul_insn;
        break;
      default:
        goto switchD_009d8e42_caseD_93;
      case INDEX_op_abs_vec:
        uVar34 = *(uint *)(tcg_out_vec_op_abs_insn + uVar56 * 4);
        base = TCG_COND_NEVER;
        pTVar37 = local_f0;
        goto LAB_009d96bb;
      case INDEX_op_ssadd_vec:
        puVar36 = tcg_out_vec_op_ssadd_insn;
        break;
      case INDEX_op_usadd_vec:
        puVar36 = tcg_out_vec_op_usadd_insn;
        break;
      case INDEX_op_sssub_vec:
        puVar36 = tcg_out_vec_op_sssub_insn;
        break;
      case INDEX_op_ussub_vec:
        puVar36 = tcg_out_vec_op_ussub_insn;
        break;
      case INDEX_op_smin_vec:
        puVar36 = tcg_out_vec_op_smin_insn;
        break;
      case INDEX_op_umin_vec:
        puVar36 = tcg_out_vec_op_umin_insn;
        break;
      case INDEX_op_smax_vec:
        puVar36 = tcg_out_vec_op_smax_insn;
        break;
      case INDEX_op_umax_vec:
        puVar36 = tcg_out_vec_op_umax_insn;
        break;
      case INDEX_op_and_vec:
        uVar34 = 0x5db;
        goto LAB_009d96bb;
      case INDEX_op_or_vec:
        uVar34 = 0x5eb;
        goto LAB_009d96bb;
      case INDEX_op_xor_vec:
        uVar34 = 0x5ef;
        goto LAB_009d96bb;
      case INDEX_op_andc_vec:
        tcg_out_vex_opc(s,(uint)(TVar47 == TCG_TYPE_V256) << 0x13 | 0x5df,r,TVar48,base,iVar21);
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
        *pbVar28 = (bVar16 & 7) + bVar62 * '\b' | 0xc0;
        goto LAB_009d9709;
      case INDEX_op_shli_vec:
        iVar40 = 6;
        goto LAB_009d928e;
      case INDEX_op_shri_vec:
        iVar40 = 2;
        goto LAB_009d928e;
      case INDEX_op_sari_vec:
        iVar40 = 4;
LAB_009d928e:
        uVar34 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar56 * 4) | 0x80000;
        if (TVar47 != TCG_TYPE_V256) {
          uVar34 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar56 * 4);
        }
        tcg_out_vex_opc(s,uVar34,iVar40,r,base,iVar21);
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
        *pbVar28 = (bVar16 & 7) + (char)iVar40 * '\b' | 0xc0;
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
LAB_009d92ea:
        *pbVar28 = bVar33;
        goto LAB_009d9709;
      case INDEX_op_shls_vec:
        puVar36 = tcg_out_vec_op_shls_insn;
        break;
      case INDEX_op_shrs_vec:
        puVar36 = tcg_out_vec_op_shrs_insn;
        break;
      case INDEX_op_sars_vec:
        puVar36 = tcg_out_vec_op_sars_insn;
        break;
      case INDEX_op_shlv_vec:
        puVar36 = tcg_out_vec_op_shlv_insn;
        break;
      case INDEX_op_shrv_vec:
        puVar36 = tcg_out_vec_op_shrv_insn;
        break;
      case INDEX_op_sarv_vec:
        puVar36 = tcg_out_vec_op_sarv_insn;
        break;
      case INDEX_op_cmp_vec:
        if (_local_e0 == TCG_COND_GT) {
          puVar36 = tcg_out_vec_op_cmpgt_insn;
        }
        else {
          if (_local_e0 != TCG_COND_EQ) {
            pcVar23 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar21 = 0xb20;
            goto LAB_009da7c7;
          }
          puVar36 = tcg_out_vec_op_cmpeq_insn;
        }
        break;
      case INDEX_op_x86_shufps_vec:
        uVar44 = 0x1c6;
        goto LAB_009d944e;
      case INDEX_op_x86_vpblendvb_vec:
        tcg_out_vex_opc(s,(uint)(TVar47 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar48,iVar21);
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
        *pbVar28 = (bVar33 & 7) + bVar62 * '\b' | 0xc0;
        ptVar29 = s->code_ptr;
        s->code_ptr = ptVar29 + 1;
        *ptVar29 = local_e0 << 4;
        goto LAB_009d9709;
      case INDEX_op_x86_blend_vec:
        uVar44 = 0x1040e;
        if (uVar34 != 1) {
          if (uVar34 != 2) {
LAB_009da7e1:
            pcVar23 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar21 = 0xb53;
            goto LAB_009da7c7;
          }
          uVar44 = 0x1040c;
          if (have_avx2_sparc != false) {
            uVar44 = 0x10402;
          }
        }
        goto LAB_009d944e;
      case INDEX_op_x86_packss_vec:
        puVar36 = tcg_out_vec_op_packss_insn;
        break;
      case INDEX_op_x86_packus_vec:
        puVar36 = tcg_out_vec_op_packus_insn;
        break;
      case INDEX_op_x86_psrldq_vec:
        tcg_out_vex_opc(s,0x573,3,r,base,iVar21);
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
        *pbVar28 = bVar16 & 7 | 0xd8;
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
        *pbVar28 = bVar33;
        goto LAB_009d9709;
      case INDEX_op_x86_vperm2i128_vec:
        uVar44 = 0x90446;
LAB_009d944e:
        tVar14 = local_e0;
        uVar34 = uVar44 | 0x80000;
        if (TVar47 != TCG_TYPE_V256) {
          uVar34 = uVar44;
        }
        tcg_out_vex_opc(s,uVar34,r,base,TVar48,iVar21);
        pbVar28 = s->code_ptr;
        s->code_ptr = pbVar28 + 1;
        *pbVar28 = (bVar33 & 7) + bVar62 * '\b' | 0xc0;
        ptVar29 = s->code_ptr;
        s->code_ptr = ptVar29 + 1;
        *ptVar29 = tVar14;
        goto LAB_009d9709;
      case INDEX_op_x86_punpckl_vec:
        puVar36 = tcg_out_vec_op_punpckl_insn;
        break;
      case INDEX_op_x86_punpckh_vec:
        puVar36 = tcg_out_vec_op_punpckh_insn;
      }
      uVar34 = *(uint *)(puVar36 + uVar56 * 4);
LAB_009d96bb:
      uVar44 = uVar34 | 0x80000;
      if (TVar47 != TCG_TYPE_V256) {
        uVar44 = uVar34;
      }
      tcg_out_vex_opc(s,uVar44,r,base,(int)pTVar37,iVar21);
      bVar16 = ((byte)pTVar37 & 7) + bVar62 * '\b';
LAB_009d96df:
      pbVar28 = s->code_ptr;
      s->code_ptr = pbVar28 + 1;
      *pbVar28 = bVar16 | 0xc0;
LAB_009d9709:
      if (uVar42 != 0) {
        uVar56 = 0;
        do {
          pTVar26 = *(TCGTemp **)(pTVar66 + uVar56 * 2 + 6);
          uVar34 = 4 << ((byte)uVar56 & 0x1f) & uVar43;
          if ((uVar43 >> ((uint)uVar56 & 0x1f) & 1) == 0) {
            if (uVar34 != 0) {
              uVar67 = *(ulong *)pTVar26;
              if (((uint)uVar67 & 0xff00) == 0x100) {
                __s[uVar67 & 0xff] = (TCGTemp *)0x0;
                uVar67 = *(ulong *)pTVar26;
              }
              uVar35 = uVar67 >> 0x1c & 0x200;
              if ((uVar67 & 0x4000000000) != 0) {
                uVar35 = 0x200;
              }
              *(ulong *)pTVar26 = uVar67 & 0xffffffffffff00ff | uVar35;
            }
          }
          else {
            temp_sync(s,pTVar26,TVar59,0,uVar34);
          }
          uVar56 = uVar56 + 1;
        } while (uVar42 != uVar56);
      }
LAB_009d9142:
      ptVar29 = s->code_ptr;
      if (s->code_gen_highwater < ptVar29) {
        return -1;
      }
      uVar56 = (long)ptVar29 - (long)s->code_buf;
      if (0xffff < uVar56) {
        return -2;
      }
      pTVar66 = *(TCGOpcode **)(pTVar66 + 2);
      in_R9 = uVar42;
    } while (pTVar66 != (TCGOpcode *)0x0);
  }
  s->gen_insn_end_off[local_124] = (uint16_t)uVar56;
  pTVar58 = (s->ldst_labels).sqh_first;
  do {
    if (pTVar58 == (TCGLabelQemuLdst *)0x0) {
      iVar21 = tcg_out_pool_finalize(s);
      if (-1 < iVar21) {
        for (pTVar37 = (s->labels).sqh_first; pTVar37 != (TCGLabel *)0x0;
            pTVar37 = (pTVar37->next).sqe_next) {
          value = (pTVar37->u).value;
          pTVar68 = (TCGRelocation *)&pTVar37->relocs;
          while (pTVar68 = (pTVar68->next).sqe_next, pTVar68 != (TCGRelocation *)0x0) {
            _Var17 = patch_reloc(pTVar68->ptr,pTVar68->type,value,pTVar68->addend);
            if (!_Var17) {
              return -2;
            }
          }
        }
        iVar21 = *(int *)&s->code_ptr - *(int *)&s->code_buf;
      }
      return iVar21;
    }
    uVar43 = pTVar58->oi;
    uVar34 = uVar43 >> 4;
    if (pTVar58->is_ld != true) {
      *(int *)pTVar58->label_ptr[0] = ((int)ptVar29 - (int)pTVar58->label_ptr[0]) + -4;
      ptVar29 = s->code_ptr;
      s->code_ptr = ptVar29 + 1;
      *ptVar29 = 'H';
      ptVar29 = s->code_ptr;
      s->code_ptr = ptVar29 + 1;
      *ptVar29 = 0x8b;
      ptVar29 = s->code_ptr;
      s->code_ptr = ptVar29 + 1;
      *ptVar29 = 0xfd;
      tcg_out_mov(s,(uint)((~uVar43 & 0x30) == 0),TCG_REG_EDX,pTVar58->datalo_reg);
      tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar43);
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar58->raddr);
      ptVar29 = s->code_ptr;
      s->code_ptr = ptVar29 + 1;
      *ptVar29 = 'A';
      ptVar29 = s->code_ptr;
      s->code_ptr = ptVar29 + 1;
      *ptVar29 = 'P';
      pptVar61 = (tcg_insn_unit **)(qemu_st_helpers + (uVar34 & 0xb));
      goto LAB_009da6c8;
    }
    uVar44 = (uint)(pTVar58->type == TCG_TYPE_I64) << 0xc;
    *(int *)pTVar58->label_ptr[0] = ((int)ptVar29 - (int)pTVar58->label_ptr[0]) + -4;
    ptVar29 = s->code_ptr;
    s->code_ptr = ptVar29 + 1;
    *ptVar29 = 'H';
    ptVar29 = s->code_ptr;
    s->code_ptr = ptVar29 + 1;
    *ptVar29 = 0x8b;
    ptVar29 = s->code_ptr;
    s->code_ptr = ptVar29 + 1;
    *ptVar29 = 0xfd;
    tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar43);
    pptVar61 = &pTVar58->raddr;
    tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar58->raddr);
    tcg_out_branch(s,1,(tcg_insn_unit *)qemu_ld_helpers[uVar34 & 0xb]);
    TVar19 = pTVar58->datalo_reg;
    switch(uVar34 & 7) {
    default:
      TVar47 = TCG_TYPE_I32;
      break;
    case 3:
      TVar47 = TCG_TYPE_I64;
      break;
    case 4:
      uVar44 = uVar44 | 0x41be;
      goto LAB_009da699;
    case 5:
      uVar44 = uVar44 | 0x1bf;
LAB_009da699:
      tcg_out_opc(s,uVar44,TVar19,0,0);
LAB_009da6ab:
      pbVar28 = s->code_ptr;
      s->code_ptr = pbVar28 + 1;
      *pbVar28 = (byte)TVar19 << 3 | 0xc0;
      goto LAB_009da6c8;
    case 6:
      pbVar28 = s->code_ptr;
      s->code_ptr = pbVar28 + 1;
      *pbVar28 = (byte)TVar19 >> 1 & 4 | 0x48;
      ptVar29 = s->code_ptr;
      s->code_ptr = ptVar29 + 1;
      *ptVar29 = 'c';
      goto LAB_009da6ab;
    case 7:
      tcg_gen_code_sparc_cold_4();
LAB_009da797:
      tcg_gen_code_sparc_cold_1();
LAB_009da79c:
      __assert_fail("s->gen_insn_end_off[num_insns] == off",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                    ,0xedf,"int tcg_gen_code_sparc(TCGContext *, TranslationBlock *)");
    }
    tcg_out_mov(s,TVar47,TVar19,TCG_REG_EAX);
LAB_009da6c8:
    tcg_out_branch(s,0,*pptVar61);
    ptVar29 = s->code_ptr;
    if (s->code_gen_highwater < ptVar29) {
      return -1;
    }
    pTVar58 = (pTVar58->next).sqe_next;
  } while( true );
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}